

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::EndProfiler(Func *this,Phase tag)

{
  ScriptContextProfiler *pSVar1;
  code *pcVar2;
  bool bVar3;
  Phase PVar4;
  int iVar5;
  Func *pFVar6;
  undefined4 *puVar7;
  Phase popped;
  Phase tag_local;
  Func *this_local;
  
  pFVar6 = GetTopFunc(this);
  iVar5 = JsUtil::Stack<Js::Phase,_Memory::ArenaAllocator,_false,_DefaultComparer>::Count
                    (&pFVar6->currentPhases);
  if (iVar5 < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x502,"(this->GetTopFunc()->currentPhases.Count() > 0)",
                       "this->GetTopFunc()->currentPhases.Count() > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pFVar6 = GetTopFunc(this);
  PVar4 = JsUtil::Stack<Js::Phase,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                    (&pFVar6->currentPhases);
  if (tag != PVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x504,"(tag == popped)","tag == popped");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pSVar1 = this->m_codeGenProfiler;
  bVar3 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ProfileFlag);
  if ((pSVar1 != (ScriptContextProfiler *)0x0) != bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x509,
                       "((this->m_codeGenProfiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))"
                       ,"Profiler tag is supplied but the profiler pointer is NULL");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (this->m_codeGenProfiler != (ScriptContextProfiler *)0x0) {
    Js::ScriptContextProfiler::ProfileEnd(this->m_codeGenProfiler,tag);
  }
  return;
}

Assistant:

void
Func::EndProfiler(Js::Phase tag)
{
#ifdef DBG
    Assert(this->GetTopFunc()->currentPhases.Count() > 0);
    Js::Phase popped = this->GetTopFunc()->currentPhases.Pop();
    Assert(tag == popped);
#endif

#ifdef PROFILE_EXEC
    AssertMsg((this->m_codeGenProfiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag),
        "Profiler tag is supplied but the profiler pointer is NULL");
    if (this->m_codeGenProfiler)
    {
        this->m_codeGenProfiler->ProfileEnd(tag);
    }
#endif
}